

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int pmain(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  lua_Integer lVar4;
  char **argv;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  uint script;
  uint uVar9;
  ulong uVar10;
  int i;
  uint uVar11;
  uint argc;
  long n;
  
  uVar11 = 0;
  lVar4 = lua_tointegerx(L,1,(int *)0x0);
  argv = (char **)lua_touserdata(L,2);
  pcVar5 = *argv;
  if (pcVar5 == (char *)0x0) {
    script = 0xffffffff;
  }
  else {
    if (*pcVar5 != '\0') {
      progname = pcVar5;
    }
    uVar11 = 0;
    script = 1;
    while( true ) {
      pcVar5 = argv[(int)script];
      if (pcVar5 == (char *)0x0) break;
      if (*pcVar5 != '-') goto LAB_0010587d;
      cVar1 = pcVar5[1];
      if (cVar1 == 'E') {
        if (pcVar5[2] != '\0') goto LAB_0010587a;
        uVar11 = uVar11 | 0x10;
      }
      else if (cVar1 == 'W') {
        if (pcVar5[2] != '\0') goto LAB_0010587a;
      }
      else if (cVar1 == 'e') {
        uVar11 = uVar11 | 8;
LAB_00105812:
        if (pcVar5[2] == '\0') {
          if ((argv[(long)(int)script + 1] == (char *)0x0) || (*argv[(long)(int)script + 1] == '-'))
          goto LAB_0010587a;
          script = script + 1;
        }
      }
      else {
        if (cVar1 == 'i') {
          uVar11 = uVar11 | 2;
        }
        else {
          if (cVar1 == 'l') goto LAB_00105812;
          if (cVar1 != 'v') {
            if (cVar1 != '\0') {
              if (cVar1 != '-') goto LAB_0010587a;
              uVar9 = 1;
              if (pcVar5[2] == '\0') {
                uVar9 = uVar11;
              }
              uVar11 = uVar9;
              script = script + (pcVar5[2] == '\0');
            }
            goto LAB_0010587d;
          }
        }
        if (pcVar5[2] != '\0') {
LAB_0010587a:
          uVar11 = 1;
          goto LAB_0010587d;
        }
        uVar11 = uVar11 | 4;
      }
      script = script + 1;
    }
    script = 0;
  }
LAB_0010587d:
  argc = (uint)lVar4;
  uVar9 = argc;
  if (0 < (int)script) {
    uVar9 = script;
  }
  luaL_checkversion_(L,504.0,0x88);
  if (uVar11 == 1) {
    pcVar5 = argv[(int)script];
    fprintf(_stderr,"%s: ",progname);
    fflush(_stderr);
    cVar1 = pcVar5[1];
    pcVar8 = "unrecognized option \'%s\'\n";
    if (cVar1 == 'l') {
      pcVar8 = "\'%s\' needs argument\n";
    }
    if (cVar1 == 'e') {
      pcVar8 = "\'%s\' needs argument\n";
    }
    fprintf(_stderr,pcVar8,pcVar5);
    fflush(_stderr);
    fprintf(_stderr,
            "usage: %s [options] [script [args]]\nAvailable options are:\n  -e stat   execute string \'stat\'\n  -i        enter interactive mode after executing \'script\'\n  -l mod    require library \'mod\' into global \'mod\'\n  -l g=mod  require library \'mod\' into global \'g\'\n  -v        show version information\n  -E        ignore environment variables\n  -W        turn warnings on\n  --        stop handling options\n  -         stop handling options and execute stdin\n"
            ,progname);
    fflush(_stderr);
    return 0;
  }
  if ((uVar11 & 4) != 0) {
    print_version();
  }
  if ((uVar11 & 0x10) == 0) {
    luaL_openlibs(L);
    createargtable(L,argv,argc,script);
    lua_gc(L,1);
    lua_gc(L,10,0,0);
    pcVar5 = getenv("LUA_INIT_5_4");
    if (pcVar5 == (char *)0x0) {
      pcVar5 = getenv("LUA_INIT");
      if (pcVar5 == (char *)0x0) goto LAB_001059b9;
      pcVar8 = "=LUA_INIT";
    }
    else {
      pcVar8 = "=LUA_INIT_5_4";
    }
    if (*pcVar5 == '@') {
      iVar2 = luaL_loadfilex(L,pcVar5 + 1,(char *)0x0);
      iVar2 = dochunk(L,iVar2);
    }
    else {
      iVar2 = dostring(L,pcVar5,pcVar8);
    }
    if (iVar2 != 0) {
      return 0;
    }
  }
  else {
    lua_pushboolean(L,1);
    lua_setfield(L,-0xf4628,"LUA_NOENV");
    luaL_openlibs(L);
    createargtable(L,argv,argc,script);
    lua_gc(L,1);
    lua_gc(L,10,0,0);
  }
LAB_001059b9:
  for (iVar2 = 1; iVar2 < (int)uVar9; iVar2 = iVar2 + 1) {
    pcVar5 = argv[iVar2];
    cVar1 = pcVar5[1];
    if (cVar1 == 'W') {
      lua_warning(L,"@on",0);
    }
    else if ((cVar1 == 'l') || (cVar1 == 'e')) {
      if (pcVar5[2] == '\0') {
        pcVar5 = argv[(long)iVar2 + 1];
        iVar2 = iVar2 + 1;
      }
      else {
        pcVar5 = pcVar5 + 2;
      }
      if (cVar1 == 'e') {
        iVar3 = dostring(L,pcVar5,"=(command line)");
      }
      else {
        pcVar8 = strchr(pcVar5,0x3d);
        if (pcVar8 == (char *)0x0) {
          pcVar6 = strchr(pcVar5,0x2d);
          pcVar8 = pcVar5;
        }
        else {
          *pcVar8 = '\0';
          pcVar6 = (char *)0x0;
          pcVar8 = pcVar8 + 1;
        }
        lua_getglobal(L,"require");
        lua_pushstring(L,pcVar8);
        iVar3 = docall(L,1,1);
        if (iVar3 == 0) {
          if (pcVar6 != (char *)0x0) {
            *pcVar6 = '\0';
          }
          lua_setglobal(L,pcVar5);
        }
        report(L,iVar3);
      }
      if (iVar3 != 0) {
        return 0;
      }
    }
  }
  if (0 < (int)script) {
    pcVar5 = argv[script];
    if ((*pcVar5 == '-') && (pcVar5[1] == '\0')) {
      pcVar8 = argv[(ulong)script - 1];
      if ((*pcVar8 == '-') && (pcVar8[1] == '-')) {
        if (pcVar8[2] != '\0') {
          pcVar5 = (char *)0x0;
        }
      }
      else {
        pcVar5 = (char *)0x0;
      }
    }
    iVar2 = luaL_loadfilex(L,pcVar5,(char *)0x0);
    if (iVar2 == 0) {
      iVar2 = lua_getglobal(L,"arg");
      if (iVar2 != 5) {
        luaL_error(L,"\'arg\' is not a table");
      }
      iVar2 = -1;
      uVar7 = luaL_len(L,-1);
      iVar3 = (int)uVar7;
      luaL_checkstack(L,iVar3 + 3,"too many arguments to script");
      uVar10 = 0;
      if (0 < iVar3) {
        uVar10 = uVar7 & 0xffffffff;
      }
      for (n = 1; n - uVar10 != 1; n = n + 1) {
        lua_rawgeti(L,iVar2,n);
        iVar2 = iVar2 + -1;
      }
      lua_rotate(L,~(uint)uVar10,-1);
      lua_settop(L,-2);
      iVar2 = docall(L,iVar3,-1);
    }
    report(L,iVar2);
    if (iVar2 != 0) {
      return 0;
    }
  }
  if ((uVar11 & 2) == 0) {
    if ((0 < (int)script) || ((uVar11 & 0xc) != 0)) goto LAB_00105cbd;
    print_version();
  }
  doREPL(L);
LAB_00105cbd:
  lua_pushboolean(L,1);
  return 1;
}

Assistant:

static int pmain (lua_State *L) {
  int argc = (int)lua_tointeger(L, 1);
  char **argv = (char **)lua_touserdata(L, 2);
  int script;
  int args = collectargs(argv, &script);
  int optlim = (script > 0) ? script : argc; /* first argv not an option */
  luaL_checkversion(L);  /* check that interpreter has correct version */
  if (args == has_error) {  /* bad arg? */
    print_usage(argv[script]);  /* 'script' has index of bad arg. */
    return 0;
  }
  if (args & has_v)  /* option '-v'? */
    print_version();
  if (args & has_E) {  /* option '-E'? */
    lua_pushboolean(L, 1);  /* signal for libraries to ignore env. vars. */
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }
  luaL_openlibs(L);  /* open standard libraries */
  createargtable(L, argv, argc, script);  /* create table 'arg' */
  lua_gc(L, LUA_GCRESTART);  /* start GC... */
  lua_gc(L, LUA_GCGEN, 0, 0);  /* ...in generational mode */
  if (!(args & has_E)) {  /* no option '-E'? */
    if (handle_luainit(L) != LUA_OK)  /* run LUA_INIT */
      return 0;  /* error running LUA_INIT */
  }
  if (!runargs(L, argv, optlim))  /* execute arguments -e and -l */
    return 0;  /* something failed */
  if (script > 0) {  /* execute main script (if there is one) */
    if (handle_script(L, argv + script) != LUA_OK)
      return 0;  /* interrupt in case of error */
  }
  if (args & has_i)  /* -i option? */
    doREPL(L);  /* do read-eval-print loop */
  else if (script < 1 && !(args & (has_e | has_v))) { /* no active option? */
    if (lua_stdin_is_tty()) {  /* running in interactive mode? */
      print_version();
      doREPL(L);  /* do read-eval-print loop */
    }
    else dofile(L, NULL);  /* executes stdin as a file */
  }
  lua_pushboolean(L, 1);  /* signal no errors */
  return 1;
}